

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binpac_buffer.cc
# Opt level: O1

void __thiscall binpac::FlowBuffer::MarkOrCopyLine_LINEBREAK(FlowBuffer *this)

{
  const_byteptr data;
  const_byteptr puVar1;
  long lVar2;
  long lVar3;
  
  data = this->orig_data_begin_;
  if ((data != (const_byteptr)0x0) && (puVar1 = this->orig_data_end_, puVar1 != (const_byteptr)0x0))
  {
    if (data < puVar1) {
      lVar3 = 0;
      do {
        if (data[lVar3] == this->linebreaker_) {
          if (this->buffer_n_ == 0) {
            this->frame_length_ = (int)lVar3;
          }
          else {
            AppendToBuffer(this,data,(int)lVar3 + 1);
            this->buffer_n_ = this->buffer_n_ + -1;
          }
          this->message_complete_ = true;
          return;
        }
        lVar2 = lVar3 + 1;
        lVar3 = lVar3 + 1;
      } while (data + lVar2 != puVar1);
    }
    AppendToBuffer(this,data,(int)puVar1 - (int)data);
    return;
  }
  return;
}

Assistant:

void FlowBuffer::MarkOrCopyLine_LINEBREAK()
	{
	if ( ! (orig_data_begin_ && orig_data_end_) )
		return;

	const_byteptr data;
	for ( data = orig_data_begin_; data < orig_data_end_; ++data )
		{
		if ( *data == linebreaker_ )
			goto found_end_of_line;
		}

	AppendToBuffer(orig_data_begin_, orig_data_end_ - orig_data_begin_);
	return;

found_end_of_line:
	if ( buffer_n_ == 0 )
		{
		frame_length_ = data - orig_data_begin_;
		}
	else
		{
		AppendToBuffer(orig_data_begin_, data + 1 - orig_data_begin_);
		// But eliminate the last 'linebreaker' character
		--buffer_n_;
		}
	message_complete_ = true;

#if DEBUG_FLOW_BUFFER
	fprintf(stderr, "%.6f Line complete: [%s]\n", network_time(),
	        string((const char*)begin(), (const char*)end()).c_str());
#endif
	}